

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PopFont(void)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  value_type *ppIVar3;
  ImFont *local_18;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  ImDrawList::PopTextureID(GImGui->CurrentWindow->DrawList);
  ImVector<ImFont_*>::pop_back(&pIVar1->FontStack);
  bVar2 = ImVector<ImFont_*>::empty(&pIVar1->FontStack);
  if (bVar2) {
    local_18 = GetDefaultFont();
  }
  else {
    ppIVar3 = ImVector<ImFont_*>::back(&pIVar1->FontStack);
    local_18 = *ppIVar3;
  }
  SetCurrentFont(local_18);
  return;
}

Assistant:

void  ImGui::PopFont()
{
    ImGuiContext& g = *GImGui;
    g.CurrentWindow->DrawList->PopTextureID();
    g.FontStack.pop_back();
    SetCurrentFont(g.FontStack.empty() ? GetDefaultFont() : g.FontStack.back());
}